

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O1

void * ibuf_reserve_slow(ibuf *ibuf,size_t size)

{
  char *__src;
  slab *psVar1;
  ulong uVar2;
  ulong size_00;
  size_t __n;
  char *pcVar3;
  
  pcVar3 = ibuf->wpos;
  if (pcVar3 + size <= ibuf->end) {
    __assert_fail("ibuf->wpos + size > ibuf->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/ibuf.c"
                  ,0x48,"void *ibuf_reserve_slow(struct ibuf *, size_t)");
  }
  __src = ibuf->rpos;
  __n = (long)pcVar3 - (long)__src;
  if (__src <= pcVar3) {
    uVar2 = (long)ibuf->end - (long)ibuf->buf;
    if (uVar2 < size + __n) {
      uVar2 = uVar2 * 2;
      if (uVar2 <= ibuf->start_capacity) {
        uVar2 = ibuf->start_capacity;
      }
      do {
        size_00 = uVar2;
        uVar2 = size_00 * 2;
      } while (size_00 < size + __n);
      psVar1 = slab_get(ibuf->slabc,size_00);
      if (psVar1 == (slab *)0x0) {
        return (void *)0x0;
      }
      memcpy(psVar1 + 1,ibuf->rpos,__n);
      if (ibuf->buf != (char *)0x0) {
        slab_put(ibuf->slabc,(slab *)(ibuf->buf + -0x30));
      }
      ibuf->buf = (char *)(psVar1 + 1);
      ibuf->end = (char *)((long)&(psVar1->next_in_cache).prev + psVar1->size);
    }
    else {
      memmove(ibuf->buf,__src,__n);
    }
    ibuf->rpos = ibuf->buf;
    pcVar3 = ibuf->buf + __n;
    ibuf->wpos = pcVar3;
    return pcVar3;
  }
  __assert_fail("ibuf->wpos >= ibuf->rpos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                ,0x56,"size_t ibuf_used(struct ibuf *)");
}

Assistant:

void *
ibuf_reserve_slow(struct ibuf *ibuf, size_t size)
{
	assert(ibuf->wpos + size > ibuf->end);
	size_t used = ibuf_used(ibuf);
	size_t capacity = ibuf_capacity(ibuf);
	/*
	 * Check if we have enough space in the
	 * current buffer. In this case de-fragment it
	 * by moving existing data to the beginning.
	 * Otherwise, get a bigger buffer.
	 */
	if (size + used <= capacity) {
		ibuf_unpoison_consumed(ibuf);
		ibuf_unpoison_unallocated(ibuf);
		memmove(ibuf->buf, ibuf->rpos, used);
	} else {
		/* Use start_capacity as allocation factor. */
		size_t new_capacity = capacity * 2;
		if (new_capacity < ibuf->start_capacity)
			new_capacity = ibuf->start_capacity;

		while (new_capacity < used + size)
			new_capacity *= 2;

		struct slab *slab = slab_get(ibuf->slabc, new_capacity);
		if (slab == NULL)
			return NULL;
		char *ptr = (char *) slab_data(slab);
		memcpy(ptr, ibuf->rpos, used);
		if (ibuf->buf)
			slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
		ibuf->buf = ptr;
		ibuf->end = ibuf->buf + slab_capacity(slab);
	}
	ibuf->rpos = ibuf->buf;
	ibuf->wpos = ibuf->rpos + used;
	return ibuf->wpos;
}